

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O3

lzma_ret lzma_filters_copy(lzma_filter *src,lzma_filter *dest,lzma_allocator *allocator)

{
  lzma_filter *plVar1;
  size_t size;
  long lVar2;
  lzma_ret lVar3;
  void *__dest;
  lzma_vli lVar4;
  anon_struct_24_5_040317c8 *paVar5;
  long lVar6;
  ulong uVar7;
  void **ppvVar8;
  ulong uVar9;
  
  lVar3 = LZMA_PROG_ERROR;
  if (dest != (lzma_filter *)0x0 && src != (lzma_filter *)0x0) {
    lVar4 = src->id;
    if (lVar4 == 0xffffffffffffffff) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (uVar9 == 4) {
          uVar9 = 4;
          lVar3 = LZMA_OPTIONS_ERROR;
LAB_0045d1a7:
          ppvVar8 = &dest[uVar9 - 1].options;
          do {
            lzma_free(*ppvVar8,allocator);
            *ppvVar8 = (void *)0x0;
            ppvVar8 = ppvVar8 + -2;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          return lVar3;
        }
        plVar1 = src + uVar9;
        dest[uVar9].id = lVar4;
        if (plVar1->options == (void *)0x0) {
          dest[uVar9].options = (void *)0x0;
        }
        else {
          paVar5 = features;
          if (plVar1->id != 0x4000000000000001) {
            lVar2 = 0;
            do {
              lVar6 = lVar2;
              if (lVar6 + 0x18 == 0xf0) {
                lVar3 = LZMA_OPTIONS_ERROR;
                goto LAB_0045d173;
              }
              lVar2 = lVar6 + 0x18;
            } while (plVar1->id != *(lzma_vli *)((long)&features[1].id + lVar6));
            paVar5 = (anon_struct_24_5_040317c8 *)(lVar6 + 0x4f1948);
          }
          size = paVar5->options_size;
          __dest = lzma_alloc(size,allocator);
          dest[uVar9].options = __dest;
          if (__dest == (void *)0x0) {
            lVar3 = LZMA_MEM_ERROR;
LAB_0045d173:
            if (uVar9 == 0) {
              return lVar3;
            }
            goto LAB_0045d1a7;
          }
          memcpy(__dest,plVar1->options,size);
        }
        uVar7 = uVar9 + 1;
        lVar4 = src[uVar7].id;
      } while (lVar4 != 0xffffffffffffffff);
      if (4 < uVar9) {
        __assert_fail("i <= LZMA_FILTERS_MAX + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/common/filter_common.c"
                      ,0xb1,
                      "lzma_ret lzma_filters_copy(const lzma_filter *, lzma_filter *, lzma_allocator *)"
                     );
      }
    }
    lVar3 = LZMA_OK;
    dest[uVar7].id = 0xffffffffffffffff;
    dest[uVar7].options = (void *)0x0;
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_copy(const lzma_filter *src, lzma_filter *dest,
		lzma_allocator *allocator)
{
	size_t i;
	lzma_ret ret;

	if (src == NULL || dest == NULL)
		return LZMA_PROG_ERROR;

	for (i = 0; src[i].id != LZMA_VLI_UNKNOWN; ++i) {
		// There must be a maximum of four filters plus
		// the array terminator.
		if (i == LZMA_FILTERS_MAX) {
			ret = LZMA_OPTIONS_ERROR;
			goto error;
		}

		dest[i].id = src[i].id;

		if (src[i].options == NULL) {
			dest[i].options = NULL;
		} else {
			// See if the filter is supported only when the
			// options is not NULL. This might be convenient
			// sometimes if the app is actually copying only
			// a partial filter chain with a place holder ID.
			//
			// When options is not NULL, the Filter ID must be
			// supported by us, because otherwise we don't know
			// how big the options are.
			size_t j;
			for (j = 0; src[i].id != features[j].id; ++j) {
				if (features[j].id == LZMA_VLI_UNKNOWN) {
					ret = LZMA_OPTIONS_ERROR;
					goto error;
				}
			}

			// Allocate and copy the options.
			dest[i].options = lzma_alloc(features[j].options_size,
					allocator);
			if (dest[i].options == NULL) {
				ret = LZMA_MEM_ERROR;
				goto error;
			}

			memcpy(dest[i].options, src[i].options,
					features[j].options_size);
		}
	}

	// Terminate the filter array.
	assert(i <= LZMA_FILTERS_MAX + 1);
	dest[i].id = LZMA_VLI_UNKNOWN;
	dest[i].options = NULL;

	return LZMA_OK;

error:
	// Free the options which we have already allocated.
	while (i-- > 0) {
		lzma_free(dest[i].options, allocator);
		dest[i].options = NULL;
	}

	return ret;
}